

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O3

void __thiscall
simplex_coboundary_enumerator<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
simplex_coboundary_enumerator
          (simplex_coboundary_enumerator<compressed_distance_matrix<(compressed_matrix_layout)0>_>
           *this,filtration_entry_t _simplex,index_t _dim,index_t _n,coefficient_t _modulus,
          compressed_distance_matrix<(compressed_matrix_layout)0> *_dist,
          binomial_coeff_table *_binomial_coeff)

{
  allocator_type local_29;
  
  (this->simplex).super_pair<float,_int> = _simplex.super_pair<float,_int>;
  this->idx_below = _simplex.super_pair<float,_int>.second;
  this->idx_above = 0;
  this->v = _n + -1;
  this->k = _dim + 1;
  this->modulus = _modulus;
  this->binomial_coeff = _binomial_coeff;
  this->dist = _dist;
  std::vector<int,_std::allocator<int>_>::vector(&this->vertices,(long)(_dim + 1),&local_29);
  get_simplex_vertices<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (_simplex.super_pair<float,_int>.second,_dim,_n,this->binomial_coeff,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start);
  return;
}

Assistant:

simplex_coboundary_enumerator(const filtration_entry_t _simplex, index_t _dim, index_t _n,
	                              const coefficient_t _modulus, const DistanceMatrix& _dist,
	                              const binomial_coeff_table& _binomial_coeff)
	    : simplex(_simplex), idx_below(get_index(_simplex)), idx_above(0), v(_n - 1), k(_dim + 1), modulus(_modulus),
	      binomial_coeff(_binomial_coeff), dist(_dist), vertices(_dim + 1) {
		get_simplex_vertices(get_index(_simplex), _dim, _n, binomial_coeff, vertices.begin());
	}